

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::BufferedFrameDeserializer::BufferedFrameDeserializer
          (BufferedFrameDeserializer *this,size_t max_capacity)

{
  uint uVar1;
  code *pcVar2;
  uint32_t uVar3;
  char *pcVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  size_t max_capacity_local;
  BufferedFrameDeserializer *this_local;
  
  perfetto::base::PagedMemory::PagedMemory(&this->buf_);
  this->capacity_ = max_capacity;
  this->size_ = 0;
  std::__cxx11::
  list<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
  ::list(&this->decoded_frames_);
  uVar3 = perfetto::base::GetSysPageSize();
  if (max_capacity % (ulong)uVar3 != 0) {
    pcVar4 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    perfetto::base::LogMessage
              (kLogError,pcVar4,0x10b48,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(max_capacity % base::GetSysPageSize() == 0)",(ulong)uVar1,pcVar7);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  uVar3 = perfetto::base::GetSysPageSize();
  if (uVar3 <= max_capacity) {
    return;
  }
  pcVar4 = perfetto::base::Basename
                     (
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
  puVar5 = (uint *)__errno_location();
  uVar1 = *puVar5;
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  perfetto::base::LogMessage
            (kLogError,pcVar4,0x10b49,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(max_capacity >= base::GetSysPageSize())",(ulong)uVar1,pcVar7);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BufferedFrameDeserializer::BufferedFrameDeserializer(size_t max_capacity)
    : capacity_(max_capacity) {
  PERFETTO_CHECK(max_capacity % base::GetSysPageSize() == 0);
  PERFETTO_CHECK(max_capacity >= base::GetSysPageSize());
}